

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O0

vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> * __thiscall
elf_parser::Elf_parser::get_symbols
          (vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>
           *__return_storage_ptr__,Elf_parser *this)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  long lVar4;
  bool bVar5;
  reference psVar6;
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [8];
  symbol_t symbol;
  uint i;
  Elf64_Sym *syms_data;
  unsigned_long total_syms;
  section_t *sec_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *__range1_2;
  section_t *sec_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *__range1_1;
  char *sh_dynstr_p;
  section_t *sec;
  iterator __end1;
  iterator __begin1;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *__range1;
  char *sh_strtab_p;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> secs;
  Elf_parser *this_local;
  vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> *symbols;
  
  secs.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  get_sections((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)&sh_strtab_p
               ,this);
  __range1 = (vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)0x0;
  __end1 = std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::begin
                     ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                      &sh_strtab_p);
  sec = (section_t *)
        std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::end
                  ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                   &sh_strtab_p);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
                                     *)&sec), bVar5) {
    psVar6 = __gnu_cxx::
             __normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
             ::operator*(&__end1);
    bVar5 = std::operator==(&psVar6->section_type,"SHT_STRTAB");
    if ((bVar5) && (bVar5 = std::operator==(&psVar6->section_name,".strtab"), bVar5)) {
      __range1 = (vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                 (this->m_mmap_program + psVar6->section_offset);
      break;
    }
    __gnu_cxx::
    __normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
    ::operator++(&__end1);
  }
  __range1_1 = (vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)0x0;
  __end1_1 = std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::begin
                       ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                        &sh_strtab_p);
  sec_1 = (section_t *)
          std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::end
                    ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                     &sh_strtab_p);
  do {
    bVar5 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
                        *)&sec_1);
    if (!bVar5) {
LAB_0012aef1:
      std::vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>::vector
                (__return_storage_ptr__);
      __end1_2 = std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::begin
                           ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *
                            )&sh_strtab_p);
      sec_2 = (section_t *)
              std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::end
                        ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                         &sh_strtab_p);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
                                 *)&sec_2), bVar5) {
        psVar6 = __gnu_cxx::
                 __normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
                 ::operator*(&__end1_2);
        bVar5 = std::operator!=(&psVar6->section_type,"SHT_SYMTAB");
        if ((!bVar5) || (bVar5 = std::operator!=(&psVar6->section_type,"SHT_DYNSYM"), !bVar5)) {
          iVar1 = psVar6->section_size;
          puVar3 = this->m_mmap_program;
          lVar4 = psVar6->section_offset;
          for (symbol.symbol_section.field_2._12_4_ = 0;
              (ulong)(uint)symbol.symbol_section.field_2._12_4_ < (ulong)(long)iVar1 / 0x18;
              symbol.symbol_section.field_2._12_4_ = symbol.symbol_section.field_2._12_4_ + 1) {
            anon_struct_208_9_02e3cb33::symbol_t((anon_struct_208_9_02e3cb33 *)local_1a0);
            symbol.symbol_value._0_4_ = symbol.symbol_section.field_2._12_4_;
            symbol.symbol_index.field_2._8_8_ =
                 *(undefined8 *)
                  (puVar3 + (ulong)(uint)symbol.symbol_section.field_2._12_4_ * 0x18 + lVar4 + 8);
            symbol.symbol_value._4_4_ =
                 *(undefined4 *)
                  (puVar3 + (ulong)(uint)symbol.symbol_section.field_2._12_4_ * 0x18 + lVar4 + 0x10)
            ;
            get_symbol_type_abi_cxx11_
                      (&local_1c0,this,
                       puVar3 + (ulong)(uint)symbol.symbol_section.field_2._12_4_ * 0x18 + lVar4 + 4
                      );
            std::__cxx11::string::operator=((string *)&symbol.symbol_num,(string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1c0);
            get_symbol_bind_abi_cxx11_
                      (&local_1e0,this,
                       puVar3 + (ulong)(uint)symbol.symbol_section.field_2._12_4_ * 0x18 + lVar4 + 4
                      );
            std::__cxx11::string::operator=
                      ((string *)(symbol.symbol_type.field_2._M_local_buf + 8),(string *)&local_1e0)
            ;
            std::__cxx11::string::~string((string *)&local_1e0);
            get_symbol_visibility_abi_cxx11_
                      (&local_200,this,
                       puVar3 + (ulong)(uint)symbol.symbol_section.field_2._12_4_ * 0x18 + lVar4 + 5
                      );
            std::__cxx11::string::operator=
                      ((string *)(symbol.symbol_bind.field_2._M_local_buf + 8),(string *)&local_200)
            ;
            std::__cxx11::string::~string((string *)&local_200);
            get_symbol_index_abi_cxx11_
                      (&local_220,this,
                       (uint16_t *)
                       (puVar3 + (ulong)(uint)symbol.symbol_section.field_2._12_4_ * 0x18 +
                                 lVar4 + 6));
            std::__cxx11::string::operator=((string *)local_1a0,(string *)&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::operator=
                      ((string *)(symbol.symbol_name.field_2._M_local_buf + 8),
                       (string *)&psVar6->section_name);
            bVar5 = std::operator==(&psVar6->section_type,"SHT_SYMTAB");
            if (bVar5) {
              uVar2 = *(uint *)(puVar3 + (ulong)(uint)symbol.symbol_section.field_2._12_4_ * 0x18 +
                                         lVar4);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_240,
                         (char *)((long)&(__range1->
                                         super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                                         )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar2),
                         &local_241);
              std::__cxx11::string::operator=
                        ((string *)(symbol.symbol_visibility.field_2._M_local_buf + 8),local_240);
              std::__cxx11::string::~string(local_240);
              std::allocator<char>::~allocator((allocator<char> *)&local_241);
            }
            bVar5 = std::operator==(&psVar6->section_type,"SHT_DYNSYM");
            if (bVar5) {
              uVar2 = *(uint *)(puVar3 + (ulong)(uint)symbol.symbol_section.field_2._12_4_ * 0x18 +
                                         lVar4);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_268,
                         (char *)((long)&(__range1_1->
                                         super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                                         )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar2),
                         &local_269);
              std::__cxx11::string::operator=
                        ((string *)(symbol.symbol_visibility.field_2._M_local_buf + 8),local_268);
              std::__cxx11::string::~string(local_268);
              std::allocator<char>::~allocator((allocator<char> *)&local_269);
            }
            std::vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>::push_back
                      (__return_storage_ptr__,(value_type *)local_1a0);
            anon_struct_208_9_02e3cb33::~symbol_t((anon_struct_208_9_02e3cb33 *)local_1a0);
          }
        }
        __gnu_cxx::
        __normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
        ::operator++(&__end1_2);
      }
      std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::~vector
                ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                 &sh_strtab_p);
      return __return_storage_ptr__;
    }
    psVar6 = __gnu_cxx::
             __normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
             ::operator*(&__end1_1);
    bVar5 = std::operator==(&psVar6->section_type,"SHT_STRTAB");
    if ((bVar5) && (bVar5 = std::operator==(&psVar6->section_name,".dynstr"), bVar5)) {
      __range1_1 = (vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                   (this->m_mmap_program + psVar6->section_offset);
      goto LAB_0012aef1;
    }
    __gnu_cxx::
    __normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

std::vector<symbol_t> Elf_parser::get_symbols() {
    std::vector<section_t> secs = get_sections();

    // get headers for offsets
    //Elf64_Ehdr *ehdr = (Elf64_Ehdr*)m_mmap_program;
    //Elf64_Shdr *shdr = (Elf64_Shdr*)(m_mmap_program + ehdr->e_shoff);

    // get strtab
    char *sh_strtab_p = nullptr;
    for(auto &sec: secs) {
        if((sec.section_type == "SHT_STRTAB") && (sec.section_name == ".strtab")){
            sh_strtab_p = (char*)m_mmap_program + sec.section_offset;
            break;
        }
    }

    // get dynstr
    char *sh_dynstr_p = nullptr;
    for(auto &sec: secs) {
        if((sec.section_type == "SHT_STRTAB") && (sec.section_name == ".dynstr")){
            sh_dynstr_p = (char*)m_mmap_program + sec.section_offset;
            break;
        }
    }

    std::vector<symbol_t> symbols;
    for(auto &sec: secs) {
        if((sec.section_type != "SHT_SYMTAB") && (sec.section_type != "SHT_DYNSYM"))
            continue;

        auto total_syms = sec.section_size / sizeof(Elf64_Sym);
        auto syms_data = (Elf64_Sym*)(m_mmap_program + sec.section_offset);

        for (unsigned int i = 0; i < total_syms; ++i) {
            symbol_t symbol;
            symbol.symbol_num       = i;
            symbol.symbol_value     = syms_data[i].st_value;
            symbol.symbol_size      = syms_data[i].st_size;
            symbol.symbol_type      = get_symbol_type(syms_data[i].st_info);
            symbol.symbol_bind      = get_symbol_bind(syms_data[i].st_info);
            symbol.symbol_visibility= get_symbol_visibility(syms_data[i].st_other);
            symbol.symbol_index     = get_symbol_index(syms_data[i].st_shndx);
            symbol.symbol_section   = sec.section_name;
            
            if(sec.section_type == "SHT_SYMTAB")
                symbol.symbol_name = std::string(sh_strtab_p + syms_data[i].st_name);
            
            if(sec.section_type == "SHT_DYNSYM")
                symbol.symbol_name = std::string(sh_dynstr_p + syms_data[i].st_name);
            
            symbols.push_back(symbol);
        }
    }
    return symbols;
}